

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Object * __thiscall
ICM::Interpreter::CheckCall
          (Interpreter *this,
          vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *Data)

{
  bool bVar1;
  Ty<11UL> *this_00;
  ObjectPtr local_88;
  ObjectPtr op;
  DataList dl;
  string local_58;
  Object *local_38;
  Object *fp;
  Element *front;
  FuncTableUnit *ftup;
  vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *Data_local;
  Interpreter *this_local;
  
  ftup = (FuncTableUnit *)Data;
  Data_local = (vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_> *)this
  ;
  fp = (Object *)
       std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>::front
                 (Data);
  bVar1 = Instruction::Element::isIdentType((Element *)fp,I_StFunc);
  if (bVar1) {
    front = (Element *)getStFunc((Element *)fp);
  }
  else {
    bVar1 = Instruction::Element::isIdentType((Element *)fp,I_DyVarb);
    if ((!bVar1) && (bVar1 = Instruction::Element::isRefer((Element *)fp), !bVar1)) {
      println<char[20]>((char (*) [20])"Error in CheckCall.");
      return (Object *)0x0;
    }
    local_38 = getObject(this,(Element *)fp);
    bVar1 = ICM::operator==(local_38->type,T_Disperse);
    if (!bVar1) {
      if (local_38->type != 0xb) {
        Object::to_string_abi_cxx11_(&local_58,local_38);
        println<char[2],std::__cxx11::string,char[19]>
                  ((char (*) [2])0x1e6ebc,&local_58,(char (*) [19])"\' is not Function.");
        std::__cxx11::string::~string((string *)&local_58);
        return (Object *)0x0;
      }
      this_00 = Object::dat<11ul>(local_38);
      front = (Element *)TypeBase::FunctionType::getData(this_00);
    }
  }
  createDispCallList((DataList *)&op,this,
                     (vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                      *)ftup,(FuncTableUnit **)&front);
  checkCall((ICM *)&local_88,(FuncTableUnit *)front,(DataList *)&op);
  this_local = (Interpreter *)ObjectPtr::get(&local_88);
  Common::lightlist<ICM::Object_*>::~lightlist((lightlist<ICM::Object_*> *)&op);
  return (Object *)this_local;
}

Assistant:

Object* CheckCall(vector<Instruction::Element> &Data) {
			const FuncTableUnit *ftup;

			Instruction::Element &front = Data.front();
			if (front.isIdentType(I_StFunc)) {
				ftup = &getStFunc(front);
			}
			else if (front.isIdentType(I_DyVarb) || front.isRefer()) {
				Object *fp = getObject(front);
				if (fp->type == T_Disperse) {
				}
				else if (fp->type != T_Function) {
					println("'", fp->to_string(), "' is not Function.");
					return nullptr;
				}
				else {
					ftup = &fp->dat<T_Function>().getData();
				}
			}
			else {
				println("Error in CheckCall.");
				return nullptr;
			}

			DataList dl = createDispCallList(Data, ftup);
			ObjectPtr op = checkCall(*ftup, dl);
			return op.get();
		}